

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

void __thiscall
hash_map<int,_Timer::IdState>::emplace(hash_map<int,_Timer::IdState> *this,int *key,IdState *v)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lck;
  IdState *v_local;
  int *key_local;
  hash_map<int,_Timer::IdState> *this_local;
  
  lck._8_8_ = v;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->hm_mutex);
  mVar1 = *(mapped_type *)lck._8_8_;
  pmVar2 = std::
           unordered_map<int,_Timer::IdState,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Timer::IdState>_>_>
           ::operator[](&this->hm_map,key);
  *pmVar2 = mVar1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void emplace(const K& key, V&& v) {
        unique_lock<mutex> lck(hm_mutex);
        hm_map[key] = move(v);
    }